

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

word Gia_ObjComputeTruth6(Gia_Man_t *p,int iObj,Vec_Int_t *vSupp,Vec_Wrd_t *vTemp)

{
  int Id;
  word wVar1;
  word *pwVar2;
  long lVar3;
  
  if (vTemp->nSize != p->nObjs) {
    __assert_fail("Vec_WrdSize(vTemp) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                  ,0x154,"word Gia_ObjComputeTruth6(Gia_Man_t *, int, Vec_Int_t *, Vec_Wrd_t *)");
  }
  if (vSupp->nSize < 7) {
    Gia_ManIncrementTravId(p);
    pwVar2 = s_Truths6;
    for (lVar3 = 0; lVar3 < vSupp->nSize; lVar3 = lVar3 + 1) {
      Id = Vec_IntEntry(vSupp,(int)lVar3);
      Gia_ObjSetTravIdCurrentId(p,Id);
      Vec_WrdWriteEntry(vTemp,Id,*pwVar2);
      pwVar2 = pwVar2 + 1;
    }
    Gia_ObjComputeTruthTable6Lut_rec(p,iObj,vTemp);
    wVar1 = Vec_WrdEntry(vTemp,iObj);
    return wVar1;
  }
  __assert_fail("Vec_IntSize(vSupp) <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                ,0x155,"word Gia_ObjComputeTruth6(Gia_Man_t *, int, Vec_Int_t *, Vec_Wrd_t *)");
}

Assistant:

word Gia_ObjComputeTruth6( Gia_Man_t * p, int iObj, Vec_Int_t * vSupp, Vec_Wrd_t * vTemp )
{
    int i, Fanin;
    assert( Vec_WrdSize(vTemp) == Gia_ManObjNum(p) );
    assert( Vec_IntSize(vSupp) <= 6 );
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vSupp, Fanin, i )
    {
        Gia_ObjSetTravIdCurrentId( p, Fanin );
        Vec_WrdWriteEntry( vTemp, Fanin, s_Truth6[i] );
    }
    Gia_ObjComputeTruthTable6Lut_rec( p, iObj, vTemp );
    return Vec_WrdEntry( vTemp, iObj );
}